

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_hash_table.hpp
# Opt level: O0

void __thiscall
poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::expand_
          (standard_hash_table<80U,_poplar::hash::vigna_hasher> *this)

{
  size_type sVar1;
  reference pvVar2;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *in_RDI;
  uint64_t i;
  this_type new_ht;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *in_stack_ffffffffffffff88;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffb8;
  uint32_t capa_bits;
  ulong uVar3;
  ulong __n;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *in_stack_ffffffffffffffc0;
  uint64_t in_stack_ffffffffffffffe8;
  uint64_t in_stack_fffffffffffffff0;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *this_00;
  
  capa_bits = (uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  this_00 = in_RDI;
  size_p2::bits(&in_RDI->capa_size_);
  standard_hash_table(in_stack_ffffffffffffffc0,capa_bits);
  uVar3 = 0;
  while( true ) {
    __n = uVar3;
    sVar1 = std::
            vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
            ::size(&in_RDI->table_);
    if (sVar1 <= uVar3) break;
    pvVar2 = std::
             vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
             ::operator[](&in_RDI->table_,__n);
    if (pvVar2->key != 0xffffffffffffffff) {
      pvVar2 = std::
               vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
               ::operator[](&in_RDI->table_,__n);
      in_stack_ffffffffffffff90 =
           (standard_hash_table<80U,_poplar::hash::vigna_hasher> *)pvVar2->key;
      std::
      vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
      ::operator[](&in_RDI->table_,__n);
      set(this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    }
    uVar3 = __n + 1;
  }
  operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  ~standard_hash_table((standard_hash_table<80U,_poplar::hash::vigna_hasher> *)0x13db23);
  return;
}

Assistant:

void expand_() {
        this_type new_ht{capa_size_.bits() + 1};
#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        for (uint64_t i = 0; i < table_.size(); ++i) {
            if (table_[i].key != UINT64_MAX) {
                new_ht.set(table_[i].key, table_[i].val);
            }
        }

        assert(size() == new_ht.size());
        *this = std::move(new_ht);
    }